

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

void BinaryenAddTableImport
               (BinaryenModuleRef module,char *internalName,char *externalModuleName,
               char *externalBaseName)

{
  Table *pTVar1;
  pointer pTVar2;
  Name local_a8;
  Name local_98;
  Name local_88;
  Name local_78 [2];
  Name local_58;
  unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> local_48;
  __single_object table_1;
  Table *table;
  char *externalBaseName_local;
  char *externalModuleName_local;
  char *internalName_local;
  BinaryenModuleRef module_local;
  
  wasm::Name::Name((Name *)&table_1,internalName);
  pTVar1 = wasm::Module::getTableOrNull(module,(Name)_table_1);
  if (pTVar1 == (Table *)0x0) {
    std::make_unique<wasm::Table>();
    wasm::Name::Name(&local_58,internalName);
    pTVar2 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->(&local_48);
    wasm::Name::operator=((Name *)pTVar2,&local_58);
    wasm::Name::Name(local_78,externalModuleName);
    pTVar2 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->(&local_48);
    wasm::Name::operator=(&(pTVar2->super_Importable).module,local_78);
    wasm::Name::Name(&local_88,externalBaseName);
    pTVar2 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->(&local_48);
    wasm::Name::operator=(&(pTVar2->super_Importable).base,&local_88);
    wasm::Module::addTable(module,&local_48);
    std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::~unique_ptr(&local_48);
  }
  else {
    wasm::Name::Name(&local_98,externalModuleName);
    wasm::Name::operator=(&(pTVar1->super_Importable).module,&local_98);
    wasm::Name::Name(&local_a8,externalBaseName);
    wasm::Name::operator=(&(pTVar1->super_Importable).base,&local_a8);
  }
  return;
}

Assistant:

void BinaryenAddTableImport(BinaryenModuleRef module,
                            const char* internalName,
                            const char* externalModuleName,
                            const char* externalBaseName) {
  auto* table = ((Module*)module)->getTableOrNull(internalName);
  if (table == nullptr) {
    auto table = std::make_unique<Table>();
    table->name = internalName;
    table->module = externalModuleName;
    table->base = externalBaseName;
    ((Module*)module)->addTable(std::move(table));
  } else {
    // already exists so just set module and base
    table->module = externalModuleName;
    table->base = externalBaseName;
  }
}